

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void tp_destroy(thread_pool_t *tp)

{
  int iVar1;
  char *__mutex;
  long lVar2;
  
  if (tp != (thread_pool_t *)0x0) {
    if (tp->threads != (pthread_t *)0x0) {
      for (lVar2 = 0; lVar2 < (int)tp->nthread; lVar2 = lVar2 + 1) {
        iVar1 = pthread_cancel(tp->threads[lVar2]);
        if (iVar1 != 0) {
          perror("pthread_cancel() failed");
        }
      }
      tp_join(tp);
      free(tp->threads);
    }
    iVar1 = pthread_cond_destroy((pthread_cond_t *)&tp->has_task);
    if (iVar1 != 0) {
      perror("pthread_cond_destroy() failed");
    }
    __mutex = (char *)&tp->lock;
    iVar1 = pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      __mutex = "pthread_mutex_destroy()";
      perror("pthread_mutex_destroy()");
    }
    if (g_self_key_inited == '\x01') {
      _tp_self_destroy((thread_pool_t *)__mutex);
      g_self_key_inited = '\0';
    }
    queue_clear(&tp->task_queue);
    memset(tp,0,0xb8);
    return;
  }
  return;
}

Assistant:

void tp_destroy(thread_pool_t *tp)
{
    int i;

    if (tp == NULL) {
        return;
    }

    if (tp->threads) {
        for (i = 0; i < (int) tp->nthread; ++i) {
            // todo: check return value
            if (pthread_cancel(tp->threads[i])) {
                perror("pthread_cancel() failed");
            }
        }

        tp_join(tp);

        free(tp->threads);
    }

    if (pthread_cond_destroy(&tp->has_task)) {
        perror("pthread_cond_destroy() failed");
    }

    if (pthread_mutex_destroy(&tp->lock)) {
        perror("pthread_mutex_destroy()");
    }

    if (g_self_key_inited) {
        _tp_self_destroy(tp);
        g_self_key_inited = false;
    }

    queue_clear(&tp->task_queue);

    bzero(tp, sizeof(thread_pool_t));
}